

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void anon_unknown.dwarf_115aec::SetupRenderState(ImDrawData *draw_data,int fb_width,int fb_height)

{
  float fVar1;
  float fVar2;
  
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  glDisable(0xb44);
  glDisable(0xb71);
  glDisable(0xb90);
  glDisable(0xb50);
  glDisable(0xb57);
  glEnable(0xc11);
  glEnableClientState(0x8074);
  glEnableClientState(0x8078);
  glEnableClientState(0x8076);
  glDisableClientState(0x8075);
  glEnable(0xde1);
  glPolygonMode(0x408,0x1b02);
  glShadeModel(0x1d01);
  glTexEnvi(0x2300,0x2200,0x2100);
  glViewport(0,0,fb_width,fb_height);
  glMatrixMode(0x1701);
  glPushMatrix();
  glLoadIdentity();
  fVar1 = (draw_data->DisplayPos).x;
  fVar2 = (draw_data->DisplayPos).y;
  glOrtho((double)fVar1,(double)(fVar1 + (draw_data->DisplaySize).x),
          (double)(fVar2 + (draw_data->DisplaySize).y),(double)fVar2,0xbff0000000000000,
          0x3ff0000000000000);
  glMatrixMode(0x1700);
  glPushMatrix();
  glLoadIdentity();
  return;
}

Assistant:

void SetupRenderState(ImDrawData* draw_data, int fb_width, int fb_height) {
    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor
    // enabled, vertex/texcoord/color pointers, polygon fill.
    glEnable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    // glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ONE, GL_ONE_MINUS_SRC_ALPHA); //
    // In order to composite our output buffer we need to preserve alpha
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glDisable(GL_STENCIL_TEST);
    glDisable(GL_LIGHTING);
    glDisable(GL_COLOR_MATERIAL);
    glEnable(GL_SCISSOR_TEST);
    glEnableClientState(GL_VERTEX_ARRAY);
    glEnableClientState(GL_TEXTURE_COORD_ARRAY);
    glEnableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_NORMAL_ARRAY);
    glEnable(GL_TEXTURE_2D);
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
    glShadeModel(GL_SMOOTH);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);

    // Setup viewport, orthographic projection matrix
    // Our visible imgui space lies from draw_data->DisplayPos (top left) to
    // draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single
    // viewport apps.
    glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height);
    glMatrixMode(GL_PROJECTION);
    glPushMatrix();
    glLoadIdentity();
#ifdef GL_VERSION_ES_CL_1_1
    glOrthof(draw_data->DisplayPos.x, draw_data->DisplayPos.x + draw_data->DisplaySize.x,
             draw_data->DisplayPos.y + draw_data->DisplaySize.y, draw_data->DisplayPos.y, -1.0f,
             +1.0f);
#else
    glOrtho(draw_data->DisplayPos.x, draw_data->DisplayPos.x + draw_data->DisplaySize.x,
            draw_data->DisplayPos.y + draw_data->DisplaySize.y, draw_data->DisplayPos.y, -1.0f,
            +1.0f);
#endif
    glMatrixMode(GL_MODELVIEW);
    glPushMatrix();
    glLoadIdentity();
}